

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::ExpectErrorText
          (CommandLineInterfaceTester *this,string_view expected_text)

{
  char *pcVar1;
  size_type in_R9;
  string_view s;
  FixedMapping replacements;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  long local_c0 [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0 [2];
  long local_a0 [2];
  char local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  undefined1 local_80 [32];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  char local_40 [8];
  char *local_38;
  size_type local_30;
  pointer local_28;
  StringLike<std::__cxx11::basic_string<char>_> *substring;
  
  s._M_len = expected_text._M_str;
  local_b0[0]._M_head_impl = local_b0[0]._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperNE<int,int>
            ((internal *)&local_d0,"0","return_code_",(int *)local_b0,&this->return_code_);
  if (local_d0._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
               ,0x84,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if (local_b0[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0[0]._M_head_impl + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  local_40[0] = '\a';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_38 = "$tmpdir";
  local_28 = (this->temp_directory_)._M_dataplus._M_p;
  local_30 = (this->temp_directory_)._M_string_length;
  s._M_str = local_40;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_
            ((string *)local_80,(lts_20250127 *)expected_text._M_len,s,replacements);
  testing::HasSubstr<std::__cxx11::string>(&local_60,(testing *)local_80,substring);
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_60.impl_.substring_._M_dataplus._M_p,
             local_60.impl_.substring_._M_dataplus._M_p + local_60.impl_.substring_._M_string_length
            );
  local_b0[0]._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,local_d0._M_head_impl,
             local_d0._M_head_impl + (long)&(local_c8->_M_dataplus)._M_p);
  if (local_d0._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0) {
    operator_delete(local_d0._M_head_impl,local_c0[0] + 1);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_90,(char *)local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "captured_stderr_");
  if (local_b0[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0) {
    operator_delete(local_b0[0]._M_head_impl,local_a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.impl_.substring_._M_dataplus._M_p != &local_60.impl_.substring_.field_2) {
    operator_delete(local_60.impl_.substring_._M_dataplus._M_p,
                    local_60.impl_.substring_.field_2._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_80._0_8_ != (AssertHelperData *)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (local_90[0] == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
               ,0x87,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  return;
}

Assistant:

void CommandLineInterfaceTester::ExpectErrorText(
    absl::string_view expected_text) {
  EXPECT_NE(0, return_code_);
  EXPECT_THAT(captured_stderr_,
              HasSubstr(absl::StrReplaceAll(expected_text,
                                            {{"$tmpdir", temp_directory_}})));
}